

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Sched.c
# Opt level: O2

int Llb_MtrFindBestColumn(Llb_Mtr_t *p,int iGrpStart)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  
  uVar2 = p->nRows;
  uVar8 = uVar2 - p->nFfs;
  uVar11 = 0;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar11;
  }
  uVar9 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar9 = uVar11;
  }
  uVar5 = (ulong)iGrpStart;
  uVar7 = 0xffffffffffffffff;
  iVar12 = -1000000000;
  uVar3 = 0xffffffff;
  do {
    iVar6 = (int)uVar3;
    if (uVar11 == uVar9) {
      if (iVar6 < 0) {
        iVar12 = 1000000000;
        iVar10 = 1000000000;
        for (; iVar6 = (int)uVar3, (long)uVar5 < (long)p->nCols + -1; uVar5 = uVar5 + 1) {
          iVar6 = 0;
          iVar13 = 0;
          for (uVar11 = 0; uVar4 != uVar11; uVar11 = uVar11 + 1) {
            if ((p->pProdVars[uVar11] == '\0') && (p->pMatrix[uVar5][uVar11] == '\x01')) {
              iVar6 = iVar6 + 1;
              iVar13 = iVar13 + p->pProdNums[uVar11];
            }
          }
          if ((iVar6 < iVar12) || ((iVar12 == iVar6 && (iVar10 < iVar13)))) {
            uVar3 = uVar5 & 0xffffffff;
            iVar12 = iVar6;
            iVar10 = iVar13;
          }
        }
      }
      return iVar6;
    }
    if (((1 < p->pRowSums[uVar11]) && (p->pProdVars[uVar11] == '\x01')) &&
       (p->pProdNums[uVar11] == 1)) {
      iVar6 = 0;
      for (uVar14 = uVar5; (long)uVar14 < (long)p->nCols + -1; uVar14 = uVar14 + 1) {
        bVar15 = p->pMatrix[uVar14][uVar11] == '\x01';
        if (bVar15) {
          uVar7 = uVar14;
        }
        uVar7 = uVar7 & 0xffffffff;
        iVar6 = iVar6 + (uint)bVar15;
      }
      if (iVar6 != 1) {
        __assert_fail("Counter == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb1Sched.c"
                      ,0x65,"int Llb_MtrFindBestColumn(Llb_Mtr_t *, int)");
      }
      iVar6 = 0;
      for (uVar14 = 0; uVar4 != uVar14; uVar14 = uVar14 + 1) {
        cVar1 = p->pProdVars[uVar14];
        if (cVar1 == '\0') {
          iVar10 = iVar6 - (uint)(p->pMatrix[(int)uVar7][uVar14] == '\x01');
        }
        else {
          iVar10 = iVar6;
          if (((cVar1 == '\x01') && (p->pMatrix[(int)uVar7][uVar14] == '\x01')) &&
             (iVar10 = iVar6 + 2, p->pProdNums[uVar14] != 1)) {
            iVar10 = iVar6;
          }
        }
        iVar6 = iVar10;
      }
      if (0 < iVar6 && iVar12 < iVar6) {
        uVar3 = uVar7 & 0xffffffff;
        iVar12 = iVar6;
      }
    }
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

int Llb_MtrFindBestColumn( Llb_Mtr_t * p, int iGrpStart )
{
    int Cost, Cost2, CostBest = ABC_INFINITY, Cost2Best = ABC_INFINITY;
    int WeightCur, WeightBest = -ABC_INFINITY, iGrp = -1, iGrpBest = -1;
    int k, c, iVar, Counter;
    // find partition that reduces partial product as much as possible
    for ( iVar = 0; iVar < p->nRows - p->nFfs; iVar++ )
    { 
        if ( p->pRowSums[iVar] < 2 )
            continue;
        // look at present variables that can be quantified
        if ( !(p->pProdVars[iVar] == 1 && p->pProdNums[iVar] == 1) )
            continue;
        // check that it appears in one partition only
        Counter = 0;
        for ( c = iGrpStart; c < p->nCols-1; c++ )
            if ( p->pMatrix[c][iVar] == 1 )
            {
                iGrp = c;
                Counter++;
            }
        assert( Counter == 1 );
        if ( Counter != 1 )
            Abc_Print( -1, "Llb_MtrFindBestColumn() Internal error!\n" );
        // find weight of this column
        WeightCur = 0;
        for ( k = 0; k < p->nRows; k++ )
        {
            // increase weight if variable k will be quantified from partial product
            if ( p->pProdVars[k] == 1 && p->pMatrix[iGrp][k] == 1 && p->pProdNums[k] == 1 ) 
                WeightCur += 2;
            // decrease weight if variable k will be added to partial product
            if ( p->pProdVars[k] == 0 && p->pMatrix[iGrp][k] == 1 )
                WeightCur--;
        }
        if ( WeightCur > 0 && WeightBest < WeightCur )
        {
            WeightBest = WeightCur;
            iGrpBest   = iGrp;
        }
    }
    if ( iGrpBest >= 0 )
        return iGrpBest;
    // could not find the group with any vars to quantify
    // select the group that contains as few extra variables as possible
    // if there is a tie, select variables that appear in less groups than others
    for ( iGrp = iGrpStart; iGrp < p->nCols-1; iGrp++ )
    {
        Cost = Cost2 = 0;
        for ( k = 0; k < p->nRows; k++ )
            if ( p->pProdVars[k] == 0 && p->pMatrix[iGrp][k] == 1 )
            {
                Cost++;
                Cost2 += p->pProdNums[k];
            }
        if ( CostBest >  Cost || 
            (CostBest == Cost && Cost2 > Cost2Best) )
        {
            CostBest  = Cost;
            Cost2Best = Cost2;
            iGrpBest  = iGrp;
        }
    }
    return iGrpBest;
}